

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

int __thiscall
cinatra::http_parser::parse_response(http_parser *this,char *data,size_t size,int last_len)

{
  int iVar1;
  undefined4 in_ECX;
  http_parser *in_RDX;
  char *in_RSI;
  long in_RDI;
  http_header *in_stack_00000010;
  size_t *in_stack_00000018;
  size_t in_stack_00000020;
  size_t msg_len;
  char *msg;
  int minor_version;
  size_t local_40;
  size_t *in_stack_ffffffffffffffc8;
  http_parser *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  http_parser *len;
  
  *(undefined8 *)(in_RDI + 0x18) = 100;
  len = in_RDX;
  std::array<cinatra::http_header,_100UL>::data((array<cinatra::http_header,_100UL> *)0x2be226);
  iVar1 = detail::phr_parse_response
                    (in_RSI,(size_t)len,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,(char **)in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8,in_stack_00000010,in_stack_00000018,in_stack_00000020
                    );
  *(int *)(in_RDI + 0x20) = iVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_40,
             (char *)in_stack_ffffffffffffffd8,(size_type)in_stack_ffffffffffffffd0);
  *(size_t *)(in_RDI + 8) = local_40;
  *(size_t **)(in_RDI + 0x10) = in_stack_ffffffffffffffc8;
  parse_body_len(in_stack_ffffffffffffffd0);
  if ((*(int *)(in_RDI + 0x20) < 0) &&
     (null_logger_t::operator<<
                ((null_logger_t *)&NULL_LOGGER,(char (*) [23])"parse http head failed"),
     *(long *)(in_RDI + 0x18) == 100)) {
    output_error(in_RDX);
  }
  return *(int *)(in_RDI + 0x20);
}

Assistant:

int parse_response(const char *data, size_t size, int last_len) {
    int minor_version;

    num_headers_ = CINATRA_MAX_HTTP_HEADER_FIELD_SIZE;
    const char *msg;
    size_t msg_len;
    header_len_ = cinatra::detail::phr_parse_response(
        data, size, &minor_version, &status_, &msg, &msg_len, headers_.data(),
        &num_headers_, last_len);
    msg_ = {msg, msg_len};
    parse_body_len();
    if (header_len_ < 0) [[unlikely]] {
      CINATRA_LOG_WARNING << "parse http head failed";
      if (num_headers_ == CINATRA_MAX_HTTP_HEADER_FIELD_SIZE) {
        output_error();
      }
    }
    return header_len_;
  }